

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

bool Jupiter::Database::append(char *file,DataBuffer *data)

{
  FILE *__stream;
  
  __stream = fopen(file,"ab");
  if (__stream != (FILE *)0x0) {
    append((FILE *)__stream,data);
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool Jupiter::Database::append(const char *file, Jupiter::DataBuffer &data)
{
	FILE *f = fopen(file, "ab");
	if (f == nullptr)
		return false;
	bool r = Jupiter::Database::append(f, data);
	fclose(f);
	return r;
}